

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

void __thiscall
rtb::Filter::Polynomial<double>::Polynomial
          (Polynomial<double> *this,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *coefficients)

{
  size_t sVar1;
  
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->coefficients_,coefficients);
  removeHighOrderZeroCoefficients(this);
  sVar1 = (long)(this->coefficients_).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->coefficients_).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4;
  this->size_ = sVar1;
  this->order_ = sVar1 - 1;
  return;
}

Assistant:

Polynomial<T>::Polynomial(const std::vector<Complex>& coefficients) :
            coefficients_(coefficients) {

            removeHighOrderZeroCoefficients();
            updateOrderAndSize();
        }